

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O0

void __thiscall VDasher::VDasher(VDasher *this,float *dashArray,size_t size)

{
  bool bVar1;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  size_t i;
  ulong local_20;
  
  in_RDI[1] = 0;
  VPointF::VPointF((VPointF *)(in_RDI + 2));
  in_RDI[3] = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  in_RDI[5] = 0;
  *(undefined1 *)(in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 0x31) = 1;
  *(undefined1 *)((long)in_RDI + 0x32) = 1;
  *(undefined1 *)((long)in_RDI + 0x33) = 1;
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX >> 1;
  if ((in_RDX & 1) != 0) {
    *(undefined4 *)((long)in_RDI + 0x24) = *(undefined4 *)(in_RSI + (in_RDX - 1) * 4);
  }
  in_RDI[3] = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined1 *)(in_RDI + 6) = 0;
  for (local_20 = 0; local_20 < (ulong)in_RDI[1]; local_20 = local_20 + 1) {
    bVar1 = vCompare(0.0,1.565016e-39);
    if (!bVar1) {
      *(undefined1 *)((long)in_RDI + 0x32) = 0;
    }
    bVar1 = vCompare(0.0,1.56507e-39);
    if (!bVar1) {
      *(undefined1 *)((long)in_RDI + 0x33) = 0;
    }
  }
  return;
}

Assistant:

VDasher::VDasher(const float *dashArray, size_t size)
{
    mDashArray = reinterpret_cast<const VDasher::Dash *>(dashArray);
    mArraySize = size / 2;
    if (size % 2) mDashOffset = dashArray[size - 1];
    mIndex = 0;
    mCurrentLength = 0;
    mDiscard = false;
    //if the dash array contains ZERO length
    // segments or ZERO lengths gaps we could
    // optimize those usecase.
    for (size_t i = 0; i < mArraySize; i++) {
        if (!vCompare(mDashArray[i].length, 0.0f))
            mNoLength = false;
        if (!vCompare(mDashArray[i].gap, 0.0f))
            mNoGap = false;
    }
}